

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromContraction
          (CollationIterator *this,CollationData *d,uint32_t contractionCE32,UChar *p,uint32_t ce32,
          UChar32 c,UErrorCode *errorCode)

{
  UChar UVar1;
  SkippedState *pSVar2;
  uint16_t uVar3;
  UStringTrieResult UVar4;
  uint32_t uVar5;
  UChar32 cp;
  int32_t n;
  int iVar6;
  int32_t lookAhead;
  UCharsTrie suffixes;
  uint32_t local_6c;
  UCharsTrie local_68;
  uint32_t local_44;
  CollationData *local_40;
  UChar *local_38;
  
  local_68.ownedArray_ = (char16_t *)0x0;
  local_68.remainingMatchLength_ = -1;
  pSVar2 = this->skipped;
  if ((pSVar2 != (SkippedState *)0x0) &&
     (0x1f < (ushort)(pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
    (pSVar2->state).uchars = p;
    (pSVar2->state).pos = p;
    (pSVar2->state).remainingMatchLength = -1;
  }
  local_68.uchars_ = p;
  local_68.pos_ = p;
  local_44 = contractionCE32;
  local_40 = d;
  local_38 = p;
  UVar4 = UCharsTrie::firstForCodePoint(&local_68,c);
  lookAhead = 1;
  n = 1;
  do {
    uVar5 = local_6c;
    if ((int)UVar4 < 2) {
      if ((UVar4 != USTRINGTRIE_NO_MATCH) && (cp = nextSkippedCodePoint(this,errorCode), -1 < cp)) {
        n = n + 1;
        goto LAB_0022ab1e;
      }
      iVar6 = 2;
      if (((local_44 >> 10 & 1) != 0) && ((local_44 >> 8 & 1) == 0 || n < lookAhead)) {
        if (1 < n) {
          backwardNumSkipped(this,n,errorCode);
          c = nextSkippedCodePoint(this,errorCode);
          lookAhead = (lookAhead - n) + 1;
          n = 1;
        }
        uVar3 = Normalizer2Impl::getFCD16(local_40->nfcImpl,c);
        if (0xff < uVar3) {
          uVar5 = nextCE32FromDiscontiguousContraction
                            (this,local_40,&local_68,ce32,lookAhead,c,errorCode);
          iVar6 = 1;
        }
      }
    }
    else {
      UVar1 = *local_68.pos_;
      if (UVar1 < L'\0') {
        ce32 = (ushort)UVar1 & 0x7fff;
        if (0x3fff < ce32) {
          if (ce32 == 0x7fff) goto LAB_0022aaac;
          ce32 = ce32 * 0x10000 + (uint)(ushort)local_68.pos_[1] + 0xc0000000;
        }
      }
      else if ((ushort)UVar1 < 0x4040) {
        ce32 = ((ushort)UVar1 >> 6) - 1;
      }
      else if ((ushort)UVar1 < 0x7fc0) {
        ce32 = ((ushort)UVar1 & 0x7fc0) * 0x400 + (uint)(ushort)local_68.pos_[1] + 0xfeff0000;
      }
      else {
LAB_0022aaac:
        ce32 = CONCAT22(local_68.pos_[1],local_68.pos_[2]);
      }
      iVar6 = 1;
      uVar5 = ce32;
      if (((UVar4 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH) &&
         (cp = nextSkippedCodePoint(this,errorCode), c = cp, -1 < cp)) {
        pSVar2 = this->skipped;
        n = 1;
        if ((pSVar2 != (SkippedState *)0x0) &&
           (0x1f < (ushort)(pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
          (pSVar2->state).uchars = local_68.uchars_;
          (pSVar2->state).pos = local_68.pos_;
          (pSVar2->state).remainingMatchLength = local_68.remainingMatchLength_;
        }
LAB_0022ab1e:
        UVar4 = UCharsTrie::nextForCodePoint(&local_68,cp);
        lookAhead = lookAhead + 1;
        iVar6 = 0;
        c = cp;
        uVar5 = local_6c;
      }
    }
    local_6c = uVar5;
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        backwardNumSkipped(this,n,errorCode);
        local_6c = ce32;
      }
      UCharsTrie::~UCharsTrie(&local_68);
      return local_6c;
    }
  } while( true );
}

Assistant:

uint32_t
CollationIterator::nextCE32FromContraction(const CollationData *d, uint32_t contractionCE32,
                                           const UChar *p, uint32_t ce32, UChar32 c,
                                           UErrorCode &errorCode) {
    // c: next code point after the original one

    // Number of code points read beyond the original code point.
    // Needed for discontiguous contraction matching.
    int32_t lookAhead = 1;
    // Number of code points read since the last match (initially only c).
    int32_t sinceMatch = 1;
    // Normally we only need a contiguous match,
    // and therefore need not remember the suffixes state from before a mismatch for retrying.
    // If we are already processing skipped combining marks, then we do track the state.
    UCharsTrie suffixes(p);
    if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
    UStringTrieResult match = suffixes.firstForCodePoint(c);
    for(;;) {
        UChar32 nextCp;
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)suffixes.getValue();
            if(!USTRINGTRIE_HAS_NEXT(match) || (c = nextSkippedCodePoint(errorCode)) < 0) {
                return ce32;
            }
            if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
            sinceMatch = 1;
        } else if(match == USTRINGTRIE_NO_MATCH || (nextCp = nextSkippedCodePoint(errorCode)) < 0) {
            // No match for c, or partial match (USTRINGTRIE_NO_VALUE) and no further text.
            // Back up if necessary, and try a discontiguous contraction.
            if((contractionCE32 & Collation::CONTRACT_TRAILING_CCC) != 0 &&
                    // Discontiguous contraction matching extends an existing match.
                    // If there is no match yet, then there is nothing to do.
                    ((contractionCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) == 0 ||
                        sinceMatch < lookAhead)) {
                // The last character of at least one suffix has lccc!=0,
                // allowing for discontiguous contractions.
                // UCA S2.1.1 only processes non-starters immediately following
                // "a match in the table" (sinceMatch=1).
                if(sinceMatch > 1) {
                    // Return to the state after the last match.
                    // (Return to sinceMatch=0 and re-fetch the first partially-matched character.)
                    backwardNumSkipped(sinceMatch, errorCode);
                    c = nextSkippedCodePoint(errorCode);
                    lookAhead -= sinceMatch - 1;
                    sinceMatch = 1;
                }
                if(d->getFCD16(c) > 0xff) {
                    return nextCE32FromDiscontiguousContraction(
                        d, suffixes, ce32, lookAhead, c, errorCode);
                }
            }
            break;
        } else {
            // Continue after partial match (USTRINGTRIE_NO_VALUE) for c.
            // It does not have a result value, therefore it is not itself "a match in the table".
            // If a partially-matched c has ccc!=0 then
            // it might be skipped in discontiguous contraction.
            c = nextCp;
            ++sinceMatch;
        }
        ++lookAhead;
        match = suffixes.nextForCodePoint(c);
    }
    backwardNumSkipped(sinceMatch, errorCode);
    return ce32;
}